

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  pointer ppSVar1;
  size_t sVar2;
  SyntaxKind *pSVar3;
  bool bVar4;
  bool bVar5;
  StatementBlockKind blocKind;
  int iVar6;
  ProceduralBlockSymbol *pPVar7;
  Diagnostic *this;
  Statement *pSVar8;
  undefined4 extraout_var;
  SmallVector<const_slang::ast::Statement_*,_5UL> *stmt;
  long lVar9;
  SmallVector<const_slang::ast::Statement_*,_5UL> *buffer_00;
  underlying_type uVar10;
  SourceRange SVar11;
  string_view arg;
  Statement *local_b0;
  ASTContext context;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  
  context.assertionInstance = sourceCtx->assertionInstance;
  context.scope.ptr = (sourceCtx->scope).ptr;
  context.lookupIndex = sourceCtx->lookupIndex;
  context._12_4_ = *(undefined4 *)&sourceCtx->field_0xc;
  context.flags.m_bits = (sourceCtx->flags).m_bits;
  context.instanceOrProc = sourceCtx->instanceOrProc;
  context.firstTempVar = sourceCtx->firstTempVar;
  context.randomizeDetails = sourceCtx->randomizeDetails;
  blocKind = SemanticFacts::getStatementBlockKind(syntax);
  if ((context.flags.m_bits & 0x1800) == 0) {
    if (blocKind == Sequential) {
      uVar10 = (stmtCtx->flags).m_bits;
      goto LAB_002c531d;
    }
    bVar4 = ASTContext::inAlwaysCombLatch(&context);
    if (bVar4) {
      pPVar7 = ASTContext::getProceduralBlock(&context);
      SVar11 = parsing::Token::range(&syntax->begin);
      this = ASTContext::addDiag(&context,(DiagCode)0x1c0008,SVar11);
      arg = SemanticFacts::getProcedureKindStr(pPVar7->procedureKind);
      Diagnostic::operator<<(this,arg);
      goto LAB_002c52b8;
    }
LAB_002c52e2:
    uVar10 = (stmtCtx->flags).m_bits;
  }
  else {
    if (blocKind - JoinAll < 2) {
      SVar11 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag(&context,(DiagCode)0x4d0008,SVar11);
LAB_002c52b8:
      pSVar8 = Statement::badStmt(comp,(Statement *)0x0);
      return pSVar8;
    }
    if (blocKind == JoinNone) {
      context.flags.m_bits = context.flags.m_bits & 0x1fffffffe7ff;
      goto LAB_002c52e2;
    }
    uVar10 = (stmtCtx->flags).m_bits;
    if (blocKind == Sequential) goto LAB_002c531d;
  }
  (stmtCtx->flags).m_bits = uVar10 & 0x14 | 2;
LAB_002c531d:
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  if (addInitializers) {
    Statement::bindScopeInitializers
              (&context,&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>);
  }
  if ((blocKind & ~JoinAll) == JoinAny) {
    context.flags.m_bits = context.flags.m_bits | 0x40000000000;
  }
  ppSVar1 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  bVar4 = false;
  for (lVar9 = 0; sVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
    pSVar3 = *(SyntaxKind **)((long)ppSVar1 + lVar9);
    bVar5 = slang::syntax::StatementSyntax::isKind(*pSVar3);
    if (bVar5) {
      iVar6 = Statement::bind((int)pSVar3,(sockaddr *)&context,(socklen_t)stmtCtx);
      local_b0 = (Statement *)CONCAT44(extraout_var,iVar6);
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)&buffer,&local_b0);
      bVar4 = (bool)(bVar4 | ((Statement *)CONCAT44(extraout_var,iVar6))->kind == Invalid);
    }
  }
  buffer_00 = &buffer;
  stmt = (SmallVector<const_slang::ast::Statement_*,_5UL> *)
         createBlockStatement
                   (comp,&buffer_00->super_SmallVectorBase<const_slang::ast::Statement_*>,
                    (SyntaxNode *)syntax,blocKind);
  if (bVar4) {
    buffer_00 = stmt;
    stmt = (SmallVector<const_slang::ast::Statement_*,_5UL> *)
           Statement::badStmt(comp,(Statement *)stmt);
  }
  SmallVectorBase<const_slang::ast::Statement_*>::cleanup
            (&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,(EVP_PKEY_CTX *)buffer_00)
  ;
  (stmtCtx->flags).m_bits = uVar10 & 0xb | (stmtCtx->flags).m_bits & 0x14;
  return (Statement *)stmt;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        SLANG_ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    // When entering a fork-join we clear any active loop flags, since the new
    // forked processes are effectively not in that loop (and statements like
    // continue and break do not apply to the outer loop).
    auto guard = ScopeGuard([&stmtCtx, savedFlags = stmtCtx.flags] {
        const auto savableFlags = StatementFlags::InLoop | StatementFlags::InForLoop |
                                  StatementFlags::InForkJoin;
        stmtCtx.flags &= ~savableFlags;
        stmtCtx.flags |= savedFlags & savableFlags;
    });

    if (blockKind != StatementBlockKind::Sequential) {
        stmtCtx.flags |= StatementFlags::InForkJoin;
        stmtCtx.flags &= ~(StatementFlags::InLoop | StatementFlags::InForLoop);
    }

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    if (blockKind == StatementBlockKind::JoinAny || blockKind == StatementBlockKind::JoinNone)
        context.flags |= ASTFlags::ForkJoinAnyNone;

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}